

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::ConstPool::add(ConstPool *this,void *data,size_t size,size_t *dstOffset)

{
  Error EVar1;
  Node *pNVar2;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *pZVar3;
  Node *pNVar4;
  ulong *in_RCX;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *in_RDX;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *in_RSI;
  ConstPool *in_RDI;
  size_t i;
  uint8_t *pData;
  size_t smallerSize;
  size_t pCount;
  size_t diff;
  size_t gapSize;
  size_t gapOffset;
  Gap *gap;
  size_t gapIndex;
  size_t offset;
  Node *node;
  size_t treeIndex;
  char *in_stack_00000250;
  int in_stack_0000025c;
  char *in_stack_00000260;
  Compare *in_stack_fffffffffffffe60;
  void **in_stack_fffffffffffffe68;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *in_stack_fffffffffffffe70;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *this_00;
  size_t in_stack_fffffffffffffe78;
  undefined1 *puVar5;
  ulong local_178;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *local_170;
  undefined8 in_stack_fffffffffffffe98;
  undefined1 shared;
  size_t in_stack_fffffffffffffea0;
  ulong offset_00;
  size_t in_stack_fffffffffffffea8;
  void *in_stack_fffffffffffffeb0;
  size_t sVar6;
  Zone *in_stack_fffffffffffffeb8;
  Gap *in_stack_fffffffffffffec0;
  Zone *this_01;
  Node *local_120;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *local_110;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *local_108;
  Error local_f4;
  undefined8 local_f0;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *local_e8;
  undefined1 *local_e0;
  undefined8 local_d8 [2];
  undefined1 *local_c8;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *local_c0;
  Zone *local_b8;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *local_b0;
  size_t local_a8;
  void *local_a0;
  Node *local_98;
  void **local_90;
  undefined8 local_88;
  Node *local_80;
  undefined1 *local_78;
  ZoneTree<asmjit::v1_14::ConstPool::Node> **local_70;
  size_t *local_68;
  undefined8 local_50;
  undefined8 *local_48;
  void *local_40;
  void **local_38;
  undefined8 local_30;
  undefined8 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *local_10;
  size_t local_8;
  
  if (in_RDX == (ZoneTree<asmjit::v1_14::ConstPool::Node> *)0x40) {
    local_120 = (Node *)0x6;
  }
  else if (in_RDX == (ZoneTree<asmjit::v1_14::ConstPool::Node> *)0x20) {
    local_120 = (Node *)0x5;
  }
  else if (in_RDX == (ZoneTree<asmjit::v1_14::ConstPool::Node> *)0x10) {
    local_120 = (Node *)0x4;
  }
  else if (in_RDX == (ZoneTree<asmjit::v1_14::ConstPool::Node> *)0x8) {
    local_120 = (Node *)0x3;
  }
  else if (in_RDX == (ZoneTree<asmjit::v1_14::ConstPool::Node> *)0x4) {
    local_120 = (Node *)0x2;
  }
  else if (in_RDX == (ZoneTree<asmjit::v1_14::ConstPool::Node> *)0x2) {
    local_120 = (Node *)0x1;
  }
  else {
    if (in_RDX != (ZoneTree<asmjit::v1_14::ConstPool::Node> *)0x1) {
      EVar1 = DebugUtils::errored(2);
      return EVar1;
    }
    local_120 = (Node *)0x0;
  }
  local_c8 = &in_RDI->field_0x8 + (long)local_120 * 0x18;
  local_30 = *(undefined8 *)(local_c8 + 0x10);
  local_28 = local_d8;
  local_110 = in_RDX;
  local_108 = in_RSI;
  local_d8[0] = local_30;
  pNVar2 = ZoneTree<asmjit::v1_14::ConstPool::Node>::
           get<void_const*,asmjit::v1_14::ConstPool::Compare>
                     (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60)
  ;
  if (pNVar2 == (Node *)0x0) {
    this_01 = (Zone *)0xffffffffffffffff;
    for (pNVar2 = local_120; shared = (undefined1)((ulong)in_stack_fffffffffffffe98 >> 0x38),
        pNVar2 != (Node *)0x6; pNVar2 = pNVar2 + 1) {
      in_stack_fffffffffffffec0 = in_RDI->_gaps[(long)local_120];
      if (in_stack_fffffffffffffec0 != (Gap *)0x0) {
        in_stack_fffffffffffffeb8 = (Zone *)in_stack_fffffffffffffec0->_offset;
        sVar6 = in_stack_fffffffffffffec0->_size;
        in_RDI->_gaps[(long)local_120] = in_stack_fffffffffffffec0->_next;
        ConstPool_freeGap(in_RDI,in_stack_fffffffffffffec0);
        local_c0 = local_110;
        local_b8 = in_stack_fffffffffffffeb8;
        if ((ulong)in_stack_fffffffffffffeb8 % (ulong)local_110 != 0) {
          DebugUtils::assertionFailed(in_stack_00000260,in_stack_0000025c,in_stack_00000250);
        }
        in_stack_fffffffffffffeb0 = (void *)(sVar6 - (long)local_110);
        this_01 = in_stack_fffffffffffffeb8;
        if (in_stack_fffffffffffffeb0 != (void *)0x0) {
          ConstPool_addGap(in_RDI,in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70);
        }
      }
    }
    if (this_01 == (Zone *)0xffffffffffffffff) {
      local_a8 = in_RDI->_size;
      local_b0 = local_110;
      local_10 = local_110;
      in_stack_fffffffffffffea8 =
           ((ulong)(local_110 + (local_a8 - 1)) & ((ulong)(local_110 + -1) ^ 0xffffffffffffffff)) -
           local_a8;
      local_8 = local_a8;
      if (in_stack_fffffffffffffea8 != 0) {
        ConstPool_addGap(in_RDI,in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70);
        in_RDI->_size = in_stack_fffffffffffffea8 + in_RDI->_size;
      }
      this_01 = (Zone *)in_RDI->_size;
      in_RDI->_size = (size_t)(local_110 + in_RDI->_size);
    }
    local_80 = Tree::_newNode(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                              in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,(bool)shared);
    if (local_80 == (Node *)0x0) {
      local_f4 = DebugUtils::errored(1);
    }
    else {
      puVar5 = &in_RDI->field_0x8 + (long)local_120 * 0x18;
      local_50 = *(undefined8 *)(puVar5 + 0x10);
      local_48 = &local_88;
      local_78 = puVar5;
      local_88 = local_50;
      ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>
                ((ZoneTree<asmjit::v1_14::ConstPool::Node> *)this_01,pNVar2,
                 (Compare *)in_stack_fffffffffffffec0);
      *(long *)(puVar5 + 8) = *(long *)(puVar5 + 8) + 1;
      local_68 = &in_RDI->_alignment;
      local_70 = &local_110;
      this_00 = local_110;
      if (local_110 <= (ZoneTree<asmjit::v1_14::ConstPool::Node> *)*local_68) {
        this_00 = (ZoneTree<asmjit::v1_14::ConstPool::Node> *)*local_68;
      }
      in_RDI->_alignment = (size_t)this_00;
      *in_RCX = (ulong)this_01;
      offset_00 = 1;
      pZVar3 = local_110;
      while ((ZoneTree<asmjit::v1_14::ConstPool::Node> *)0x4 < pZVar3) {
        offset_00 = offset_00 << 1;
        pZVar3 = (ZoneTree<asmjit::v1_14::ConstPool::Node> *)((ulong)pZVar3 >> 1);
        if (local_120 == (Node *)0x0) {
          DebugUtils::assertionFailed(in_stack_00000260,in_stack_0000025c,in_stack_00000250);
        }
        local_120 = local_120 + -1;
        local_170 = local_108;
        for (local_178 = 0; local_178 < offset_00; local_178 = local_178 + 1) {
          local_e0 = &in_RDI->field_0x8 + (long)local_120 * 0x18;
          local_e8 = local_170;
          local_20 = *(undefined8 *)(local_e0 + 0x10);
          local_18 = &local_f0;
          local_f0 = local_20;
          pNVar4 = ZoneTree<asmjit::v1_14::ConstPool::Node>::
                   get<void_const*,asmjit::v1_14::ConstPool::Compare>
                             (this_00,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
          if (pNVar4 == (Node *)0x0) {
            local_98 = Tree::_newNode(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                      in_stack_fffffffffffffea8,offset_00,
                                      SUB81((ulong)pZVar3 >> 0x38,0));
            in_stack_fffffffffffffe68 = (void **)(&in_RDI->field_0x8 + (long)local_120 * 0x18);
            local_40 = in_stack_fffffffffffffe68[2];
            local_38 = &local_a0;
            local_90 = in_stack_fffffffffffffe68;
            local_a0 = local_40;
            ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>
                      ((ZoneTree<asmjit::v1_14::ConstPool::Node> *)this_01,pNVar2,
                       (Compare *)in_stack_fffffffffffffec0);
            in_stack_fffffffffffffe68[1] = (void *)((long)in_stack_fffffffffffffe68[1] + 1);
          }
          local_170 = pZVar3 + (long)local_170;
        }
      }
      if (in_RDI->_minItemSize == 0) {
        in_RDI->_minItemSize = (size_t)local_110;
      }
      else {
        if ((ZoneTree<asmjit::v1_14::ConstPool::Node> *)in_RDI->_minItemSize <= local_110) {
          local_110 = (ZoneTree<asmjit::v1_14::ConstPool::Node> *)in_RDI->_minItemSize;
        }
        in_RDI->_minItemSize = (size_t)local_110;
      }
      local_f4 = 0;
    }
  }
  else {
    *in_RCX = (ulong)*(uint *)(pNVar2 + 0x14);
    local_f4 = 0;
  }
  return local_f4;
}

Assistant:

Error ConstPool::add(const void* data, size_t size, size_t& dstOffset) noexcept {
  size_t treeIndex;

  if (size == 64)
    treeIndex = kIndex64;
  else if (size == 32)
    treeIndex = kIndex32;
  else if (size == 16)
    treeIndex = kIndex16;
  else if (size == 8)
    treeIndex = kIndex8;
  else if (size == 4)
    treeIndex = kIndex4;
  else if (size == 2)
    treeIndex = kIndex2;
  else if (size == 1)
    treeIndex = kIndex1;
  else
    return DebugUtils::errored(kErrorInvalidArgument);

  ConstPool::Node* node = _tree[treeIndex].get(data);
  if (node) {
    dstOffset = node->_offset;
    return kErrorOk;
  }

  // Before incrementing the current offset try if there is a gap that can be used for the requested data.
  size_t offset = ~size_t(0);
  size_t gapIndex = treeIndex;

  while (gapIndex != kIndexCount - 1) {
    ConstPool::Gap* gap = _gaps[treeIndex];

    // Check if there is a gap.
    if (gap) {
      size_t gapOffset = gap->_offset;
      size_t gapSize = gap->_size;

      // Destroy the gap for now.
      _gaps[treeIndex] = gap->_next;
      ConstPool_freeGap(this, gap);

      offset = gapOffset;
      ASMJIT_ASSERT(Support::isAligned<size_t>(offset, size));

      gapSize -= size;
      if (gapSize > 0)
        ConstPool_addGap(this, gapOffset, gapSize);
    }

    gapIndex++;
  }

  if (offset == ~size_t(0)) {
    // Get how many bytes have to be skipped so the address is aligned accordingly to the 'size'.
    size_t diff = Support::alignUpDiff<size_t>(_size, size);

    if (diff != 0) {
      ConstPool_addGap(this, _size, diff);
      _size += diff;
    }

    offset = _size;
    _size += size;
  }

  // Add the initial node to the right index.
  node = ConstPool::Tree::_newNode(_zone, data, size, offset, false);
  if (ASMJIT_UNLIKELY(!node))
    return DebugUtils::errored(kErrorOutOfMemory);

  _tree[treeIndex].insert(node);
  _alignment = Support::max<size_t>(_alignment, size);

  dstOffset = offset;

  // Now create a bunch of shared constants that are based on the data pattern. We stop at size 4,
  // it probably doesn't make sense to split constants down to 1 byte.
  size_t pCount = 1;
  size_t smallerSize = size;

  while (smallerSize > 4) {
    pCount <<= 1;
    smallerSize >>= 1;

    ASMJIT_ASSERT(treeIndex != 0);
    treeIndex--;

    const uint8_t* pData = static_cast<const uint8_t*>(data);
    for (size_t i = 0; i < pCount; i++, pData += smallerSize) {
      node = _tree[treeIndex].get(pData);
      if (node) continue;

      node = ConstPool::Tree::_newNode(_zone, pData, smallerSize, offset + (i * smallerSize), true);
      _tree[treeIndex].insert(node);
    }
  }

  if (_minItemSize == 0)
    _minItemSize = size;
  else
    _minItemSize = Support::min(_minItemSize, size);

  return kErrorOk;
}